

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__decode_and_resample_upsample(stbir__info *stbir_info,int n)

{
  float fVar1;
  float *output_buffer;
  
  stbir__decode_scanline(stbir_info,n);
  fVar1 = stbir_info->horizontal_scale;
  output_buffer = stbir__add_empty_ring_buffer_entry(stbir_info,n);
  if (fVar1 <= 1.0) {
    stbir__resample_horizontal_downsample(stbir_info,output_buffer);
    return;
  }
  stbir__resample_horizontal_upsample(stbir_info,output_buffer);
  return;
}

Assistant:

static void stbir__decode_and_resample_upsample(stbir__info* stbir_info, int n)
{
    // Decode the nth scanline from the source image into the decode buffer.
    stbir__decode_scanline(stbir_info, n);

    // Now resample it into the ring buffer.
    if (stbir__use_width_upsampling(stbir_info))
        stbir__resample_horizontal_upsample(stbir_info, stbir__add_empty_ring_buffer_entry(stbir_info, n));
    else
        stbir__resample_horizontal_downsample(stbir_info, stbir__add_empty_ring_buffer_entry(stbir_info, n));

    // Now it's sitting in the ring buffer ready to be used as source for the vertical sampling.
}